

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

size_t __thiscall caffe::LRNParameter::ByteSizeLong(LRNParameter *this)

{
  int iVar1;
  uint uVar2;
  UnknownFieldSet *unknown_fields;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar6 = 0;
  }
  else {
    unknown_fields = LRNParameter::unknown_fields(this);
    sVar6 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 0x3f) != 0) {
    if ((uVar2 & 1) != 0) {
      sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->norm_region_);
      sVar6 = sVar6 + sVar3 + 1;
      uVar2 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar2 & 2) != 0) {
      sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->engine_);
      sVar6 = sVar6 + sVar3 + 1;
      uVar2 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar2 & 4) != 0) {
      uVar4 = this->local_size_ | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar6 + (iVar1 * 9 + 0x49U >> 6) + 1;
    }
    sVar3 = sVar6 + 5;
    if ((uVar2 & 8) == 0) {
      sVar3 = sVar6;
    }
    sVar5 = sVar3 + 5;
    if ((uVar2 & 0x10) == 0) {
      sVar5 = sVar3;
    }
    sVar6 = sVar5 + 5;
    if ((uVar2 & 0x20) == 0) {
      sVar6 = sVar5;
    }
  }
  this->_cached_size_ = (int)sVar6;
  return sVar6;
}

Assistant:

size_t LRNParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.LRNParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 63u) {
    // optional .caffe.LRNParameter.NormRegion norm_region = 4 [default = ACROSS_CHANNELS];
    if (has_norm_region()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->norm_region());
    }

    // optional .caffe.LRNParameter.Engine engine = 6 [default = DEFAULT];
    if (has_engine()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->engine());
    }

    // optional uint32 local_size = 1 [default = 5];
    if (has_local_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->local_size());
    }

    // optional float alpha = 2 [default = 1];
    if (has_alpha()) {
      total_size += 1 + 4;
    }

    // optional float beta = 3 [default = 0.75];
    if (has_beta()) {
      total_size += 1 + 4;
    }

    // optional float k = 5 [default = 1];
    if (has_k()) {
      total_size += 1 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}